

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_filter_plain_scalar(Parser *this,substr s,size_t indentation)

{
  char cVar1;
  code *pcVar2;
  size_t l;
  size_t b;
  substr dst;
  substr r_00;
  bool bVar3;
  error_flags eVar4;
  ulong in_RDX;
  basic_substring<char> *in_RDI;
  ro_substr rVar5;
  csubstr cVar6;
  char msg_1 [31];
  char msg [42];
  char curr;
  size_t i;
  bool filtered_chars;
  size_t pos;
  substr r;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Parser *in_stack_fffffffffffffe38;
  Location *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  char local_158 [32];
  size_t in_stack_fffffffffffffec8;
  Parser *in_stack_fffffffffffffed0;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Parser *in_stack_ffffffffffffff10;
  substr in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Parser *in_stack_ffffffffffffff50;
  Parser *in_stack_ffffffffffffff60;
  size_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  size_t *local_88;
  bool local_79;
  char *local_78;
  basic_substring<char_const> local_70 [16];
  basic_substring<char> local_60 [2];
  ulong local_38;
  char *local_20;
  undefined4 local_18;
  size_t *local_10;
  basic_substring<char> *local_8;
  
  local_38 = in_RDX;
  basic_substring<char_const>::basic_substring<3ul>(local_70,(char (*) [3])" \t");
  rVar5.str._4_4_ = in_stack_fffffffffffffe84;
  rVar5.str._0_4_ = in_stack_fffffffffffffe80;
  rVar5.len._0_4_ = in_stack_fffffffffffffe88;
  rVar5.len._4_4_ = in_stack_fffffffffffffe8c;
  local_60[0] = basic_substring<char>::triml(in_RDI,rVar5);
  _grow_filter_arena(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_78 = (char *)0x0;
  local_79 = false;
  for (local_88 = (size_t *)0x0; local_88 < local_60[0].len;
      local_88 = (size_t *)((long)local_88 + 1)) {
    cVar1 = *(char *)((long)local_88 +
                     (long)((stack<c4::yml::Parser::State,_16UL> *)((long)local_60[0].str + 0x38) +
                           -1) + 0x980);
    if ((cVar1 == ' ') || (cVar1 == '\t')) {
      in_stack_ffffffffffffff60 = (Parser *)local_60[0].str;
      in_stack_ffffffffffffff68 = (size_t *)local_60[0].len;
      _filter_ws<false>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                        (size_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                        (size_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    else if (cVar1 == '\n') {
      r_00.len._0_7_ = in_stack_ffffffffffffff70;
      r_00.str = (char *)in_stack_ffffffffffffff68;
      r_00.len._7_1_ = 10;
      in_stack_ffffffffffffff50 = (Parser *)local_60[0].str;
      local_79 = _filter_nl<false,false>
                           (in_stack_ffffffffffffff60,r_00,(size_t *)local_60[0].len,
                            (size_t *)local_60[0].str,(size_t)in_stack_ffffffffffffff48);
    }
    else if (cVar1 != '\r') {
      local_8 = local_60;
      local_10 = local_88;
      if (local_60[0].len <= local_88) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        local_20 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_18 = 0x14c3;
        handle_error(0x389522,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      local_78[in_RDI[0xa7].len] = local_60[0].str[(long)local_10];
      local_78 = local_78 + 1;
    }
  }
  if (in_RDI[0xa8].str < local_78) {
    memcpy(&stack0xffffffffffffff18,"check failed: (pos <= m_filter_arena.len)",0x2a);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar2 = (code *)in_RDI[0x9e].len;
    b = CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    l = CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe28 = in_stack_ffffffffffffff00;
    in_stack_fffffffffffffe2c = in_stack_ffffffffffffff04;
    in_stack_fffffffffffffe30 = in_stack_ffffffffffffff08;
    in_stack_fffffffffffffe34 = in_stack_ffffffffffffff0c;
    Location::Location(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,b,l,
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe38 = in_stack_ffffffffffffff10;
    (*pcVar2)(&stack0xffffffffffffff18,0x2a,in_RDI[0x9d].str);
    in_stack_fffffffffffffe20 = uStack_108;
    in_stack_fffffffffffffe24 = uStack_104;
  }
  if ((local_78 < local_60[0].len) || (local_79 != false)) {
    dst.len = (size_t)in_stack_ffffffffffffff50;
    dst.str = in_stack_ffffffffffffff48;
    local_60[0] = _finish_filter_arena(in_stack_ffffffffffffff40,dst,in_stack_ffffffffffffff38);
  }
  if (local_38 < local_60[0].len) {
    builtin_strncpy(local_158,"check failed: (s.len >= r.len)",0x1f);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    pcVar2 = (code *)in_RDI[0x9e].len;
    Location::Location(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    (*pcVar2)(local_158,0x1f,in_RDI[0x9d].str);
  }
  rVar5 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x346cb9);
  cVar6.str = rVar5.str;
  cVar6.len = rVar5.len;
  return cVar6;
}

Assistant:

csubstr Parser::_filter_plain_scalar(substr s, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfps(...) _c4dbgpf("filt_plain_scalar" __VA_ARGS__)
    #else
    #define _c4dbgfps(...)
    #endif

    _c4dbgfps("before=~~~{}~~~", s);

    substr r = s.triml(" \t");
    _grow_filter_arena(r.len);
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r.str[i];
        _c4dbgfps("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/false>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/false, /*keep_trailing_ws*/false>(r, &i, &pos, indentation);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else
        {
            m_filter_arena.str[pos++] = r[i];
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgfps("#filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfps
    return r;
}